

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceGetOverclockControls
          (zes_device_handle_t hDevice,zes_overclock_domain_t domainType,
          uint32_t *pAvailableControls)

{
  zes_pfnDeviceGetOverclockControls_t pfnGetOverclockControls;
  ze_result_t result;
  uint32_t *pAvailableControls_local;
  zes_overclock_domain_t domainType_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetOverclockControls._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cac0 != (code *)0x0) {
    pfnGetOverclockControls._4_4_ = (*DAT_0011cac0)(hDevice,domainType,pAvailableControls);
  }
  return pfnGetOverclockControls._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetOverclockControls(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_overclock_domain_t domainType,              ///< [in] Domain type.
        uint32_t* pAvailableControls                    ///< [in,out] Returns the overclock controls that are supported for the
                                                        ///< specified overclock domain (a bit for each of enum
                                                        ///< ::zes_overclock_control_t).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetOverclockControls = context.zesDdiTable.Device.pfnGetOverclockControls;
        if( nullptr != pfnGetOverclockControls )
        {
            result = pfnGetOverclockControls( hDevice, domainType, pAvailableControls );
        }
        else
        {
            // generic implementation
        }

        return result;
    }